

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5IterSetOutputs_Col(Fts5Iter *pIter,Fts5SegIter *pSeg)

{
  Fts5SegIter *pSeg_local;
  Fts5Iter *pIter_local;
  
  sqlite3Fts5BufferZero(&pIter->poslist);
  fts5SegiterPoslist(pIter->pIndex,pSeg,pIter->pColset,&pIter->poslist);
  (pIter->base).iRowid = pSeg->iRowid;
  (pIter->base).pData = (pIter->poslist).p;
  (pIter->base).nData = (pIter->poslist).n;
  return;
}

Assistant:

static void fts5IterSetOutputs_Col(Fts5Iter *pIter, Fts5SegIter *pSeg){
  fts5BufferZero(&pIter->poslist);
  fts5SegiterPoslist(pIter->pIndex, pSeg, pIter->pColset, &pIter->poslist);
  pIter->base.iRowid = pSeg->iRowid;
  pIter->base.pData = pIter->poslist.p;
  pIter->base.nData = pIter->poslist.n;
}